

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

void zSetRWork(int m,int panel_size,doublecomplex *dworkptr,doublecomplex **dense,
              doublecomplex **tempv)

{
  int iVar1;
  int iVar2;
  int local_54;
  int local_48;
  int rowblk;
  int maxsuper;
  doublecomplex zero;
  doublecomplex **tempv_local;
  doublecomplex **dense_local;
  doublecomplex *dworkptr_local;
  int panel_size_local;
  int m_local;
  
  zero.i = (double)tempv;
  memset(&rowblk,0,0x10);
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_48 = sp_ienv(3);
  }
  else {
    local_48 = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  *dense = dworkptr;
  *(doublecomplex **)zero.i = *dense + panel_size * m;
  zfill(*dense,m * panel_size,_rowblk);
  local_54 = m;
  if (m <= (local_48 + iVar1) * panel_size) {
    local_54 = (local_48 + iVar1) * panel_size;
  }
  zfill(*(doublecomplex **)zero.i,local_54,_rowblk);
  return;
}

Assistant:

void
zSetRWork(int m, int panel_size, doublecomplex *dworkptr,
	 doublecomplex **dense, doublecomplex **tempv)
{
    doublecomplex zero = {0.0, 0.0};

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    zfill (*dense, m * panel_size, zero);
    zfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}